

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O1

LY_ERR parse_grouping(lysp_yang_ctx *ctx,lysp_node *parent,lysp_node_grp **groupings)

{
  lysp_node **siblings;
  lysp_node_grp *plVar1;
  lyd_node *plVar2;
  lysp_ext_instance *object;
  LY_ERR LVar3;
  lysp_node_grp *parent_00;
  lysp_node_grp *plVar4;
  char **ppcVar5;
  char *format;
  ly_stmt parent_stmt;
  ly_ctx *plVar6;
  LY_ERR LVar7;
  char *pcVar8;
  bool bVar9;
  ly_stmt kw;
  char *word;
  size_t word_len;
  char *buf;
  undefined4 in_stack_ffffffffffffff70;
  ly_stmt in_stack_ffffffffffffff74;
  char *local_88;
  size_t local_80;
  lysp_ext_instance **local_78;
  lysp_node_action **local_70;
  lysp_node_notif **local_68;
  char **local_60;
  char **local_58;
  uint16_t *local_50;
  lysp_tpdf **local_48;
  lysp_node_grp **local_40;
  char *local_38;
  
  parent_00 = (lysp_node_grp *)calloc(1,0x68);
  if (parent_00 == (lysp_node_grp *)0x0) {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar6 = (ly_ctx *)0x0;
    }
    else {
      plVar6 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_log(plVar6,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_grouping");
  }
  else {
    plVar1 = *groupings;
    if (*groupings == (lysp_node_grp *)0x0) {
      *groupings = parent_00;
    }
    else {
      do {
        plVar4 = plVar1;
        plVar1 = (lysp_node_grp *)(plVar4->field_0).node.next;
      } while (plVar1 != (lysp_node_grp *)0x0);
      (plVar4->field_0).field_1.next = parent_00;
    }
  }
  if (parent_00 == (lysp_node_grp *)0x0) {
    LVar7 = LY_EMEM;
  }
  else {
    LVar3 = get_argument(ctx,Y_IDENTIF_ARG,(uint16_t *)0x0,&local_88,&local_38,&local_80);
    LVar7 = LVar3 + (LVar3 == LY_SUCCESS);
    if (LVar3 == LY_SUCCESS) {
      if (local_38 == (char *)0x0) {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar6 = (ly_ctx *)0x0;
        }
        else {
          plVar6 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        pcVar8 = local_88;
        if (local_80 == 0) {
          pcVar8 = "";
        }
        LVar7 = lydict_insert(plVar6,pcVar8,local_80,&(parent_00->field_0).node.name);
      }
      else {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar6 = (ly_ctx *)0x0;
        }
        else {
          plVar6 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        LVar7 = lydict_insert_zc(plVar6,local_88,&(parent_00->field_0).node.name);
      }
      if (LVar7 == LY_SUCCESS) {
        (parent_00->field_0).node.nodetype = 0x4000;
        (parent_00->field_0).node.parent = parent;
        LVar7 = get_keyword(ctx,(ly_stmt *)&stack0xffffffffffffff74,&local_88,&local_80);
        if (LVar7 == LY_SUCCESS) {
          if (in_stack_ffffffffffffff74 == LY_STMT_SYNTAX_SEMICOLON) {
            bVar9 = true;
          }
          else {
            if (in_stack_ffffffffffffff74 != LY_STMT_SYNTAX_LEFT_BRACE) {
              if (ctx == (lysp_yang_ctx *)0x0) {
                plVar6 = (ly_ctx *)0x0;
              }
              else {
                plVar6 = (ly_ctx *)
                         **(undefined8 **)
                           (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              }
              pcVar8 = lyplg_ext_stmt2str(in_stack_ffffffffffffff74);
              ly_vlog(plVar6,(char *)0x0,LYVE_SYNTAX_YANG,
                      "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar8);
              return LY_EVALID;
            }
            LVar7 = get_keyword(ctx,(ly_stmt *)&stack0xffffffffffffff74,&local_88,&local_80);
            if (LVar7 != LY_SUCCESS) {
              return LVar7;
            }
            bVar9 = in_stack_ffffffffffffff74 == LY_STMT_SYNTAX_RIGHT_BRACE;
          }
          if (!bVar9) {
            local_78 = &(parent_00->field_0).node.exts;
            local_68 = &parent_00->notifs;
            local_40 = &parent_00->groupings;
            local_70 = &parent_00->actions;
            local_48 = &parent_00->typedefs;
            siblings = &parent_00->child;
            local_50 = &(parent_00->field_0).node.flags;
            local_58 = &(parent_00->field_0).node.ref;
            local_60 = &(parent_00->field_0).node.dsc;
            do {
              if ((int)in_stack_ffffffffffffff74 < 0x2000) {
                if ((int)in_stack_ffffffffffffff74 < 0x200) {
                  if ((int)in_stack_ffffffffffffff74 < 0x20) {
                    if (in_stack_ffffffffffffff74 == LY_STMT_NOTIFICATION) {
                      plVar2 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                      if (*(byte *)&plVar2[2].schema < 2) {
                        if (ctx == (lysp_yang_ctx *)0x0) {
                          plVar6 = (ly_ctx *)0x0;
                        }
                        else {
                          plVar6 = (ly_ctx *)**(undefined8 **)plVar2;
                        }
                        pcVar8 = "notification";
LAB_0017954f:
                        format = 
                        "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                        ;
                        goto LAB_0017955d;
                      }
                      LVar7 = parse_notif(ctx,(lysp_node *)parent_00,local_68);
                    }
                    else {
                      if (in_stack_ffffffffffffff74 != LY_STMT_ACTION) goto LAB_001794b0;
                      plVar2 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                      if (*(byte *)&plVar2[2].schema < 2) {
                        if (ctx == (lysp_yang_ctx *)0x0) {
                          plVar6 = (ly_ctx *)0x0;
                        }
                        else {
                          plVar6 = (ly_ctx *)**(undefined8 **)plVar2;
                        }
                        pcVar8 = "action";
                        goto LAB_0017954f;
                      }
                      LVar7 = parse_action(ctx,(lysp_node *)parent_00,local_70);
                    }
                  }
                  else {
                    if (in_stack_ffffffffffffff74 == LY_STMT_ANYDATA) {
                      plVar2 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                      if (*(byte *)&plVar2[2].schema < 2) {
                        if (ctx == (lysp_yang_ctx *)0x0) {
                          plVar6 = (ly_ctx *)0x0;
                        }
                        else {
                          plVar6 = (ly_ctx *)**(undefined8 **)plVar2;
                        }
                        pcVar8 = "anydata";
                        goto LAB_0017954f;
                      }
                    }
                    else if (in_stack_ffffffffffffff74 != LY_STMT_ANYXML) goto LAB_001794b0;
                    LVar7 = parse_any(ctx,in_stack_ffffffffffffff74,(lysp_node *)parent_00,siblings)
                    ;
                  }
                }
                else if ((int)in_stack_ffffffffffffff74 < 0x800) {
                  if (in_stack_ffffffffffffff74 == LY_STMT_CHOICE) {
                    LVar7 = parse_choice(ctx,(lysp_node *)parent_00,siblings);
                  }
                  else {
                    if (in_stack_ffffffffffffff74 != LY_STMT_CONTAINER) goto LAB_001794b0;
                    LVar7 = parse_container(ctx,(lysp_node *)parent_00,siblings);
                  }
                }
                else if (in_stack_ffffffffffffff74 == LY_STMT_GROUPING) {
                  LVar7 = parse_grouping(ctx,(lysp_node *)parent_00,local_40);
                }
                else {
                  if (in_stack_ffffffffffffff74 != LY_STMT_LEAF) goto LAB_001794b0;
                  LVar7 = parse_leaf(ctx,(lysp_node *)parent_00,siblings);
                }
              }
              else if ((int)in_stack_ffffffffffffff74 < 0xf0000) {
                if ((int)in_stack_ffffffffffffff74 < 0x8000) {
                  if (in_stack_ffffffffffffff74 == LY_STMT_LEAF_LIST) {
                    LVar7 = parse_leaflist(ctx,(lysp_node *)parent_00,siblings);
                  }
                  else {
                    if (in_stack_ffffffffffffff74 != LY_STMT_LIST) goto LAB_001794b0;
                    LVar7 = parse_list(ctx,(lysp_node *)parent_00,siblings);
                  }
                }
                else if (in_stack_ffffffffffffff74 == LY_STMT_USES) {
                  LVar7 = parse_uses(ctx,(lysp_node *)parent_00,siblings);
                }
                else {
                  if (in_stack_ffffffffffffff74 != LY_STMT_DESCRIPTION) goto LAB_001794b0;
                  pcVar8 = *local_60;
                  parent_stmt = LY_STMT_DESCRIPTION;
                  ppcVar5 = local_60;
LAB_001792ca:
                  LVar7 = parse_text_field(ctx,pcVar8,parent_stmt,(uint32_t)ppcVar5,(char **)0x2,
                                           Y_IDENTIF_ARG,(uint16_t *)local_78,
                                           (lysp_ext_instance **)
                                           CONCAT44(in_stack_ffffffffffffff74,
                                                    in_stack_ffffffffffffff70));
                }
              }
              else if ((int)in_stack_ffffffffffffff74 < 0x2c0000) {
                if (in_stack_ffffffffffffff74 != LY_STMT_EXTENSION_INSTANCE) {
                  if (in_stack_ffffffffffffff74 == LY_STMT_REFERENCE) {
                    pcVar8 = *local_58;
                    parent_stmt = LY_STMT_REFERENCE;
                    ppcVar5 = local_58;
                    goto LAB_001792ca;
                  }
LAB_001794b0:
                  if (ctx == (lysp_yang_ctx *)0x0) {
                    plVar6 = (ly_ctx *)0x0;
                  }
                  else {
                    plVar6 = (ly_ctx *)
                             **(undefined8 **)
                               (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                  }
                  pcVar8 = lyplg_ext_stmt2str(in_stack_ffffffffffffff74);
                  format = "Invalid keyword \"%s\" as a child of \"%s\".";
LAB_0017955d:
                  ly_vlog(plVar6,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar8,"grouping");
                  return LY_EVALID;
                }
                LVar7 = parse_ext(ctx,local_88,local_80,parent_00,LY_STMT_GROUPING,0,local_78);
              }
              else if (in_stack_ffffffffffffff74 == LY_STMT_STATUS) {
                LVar7 = parse_status(ctx,local_50,local_78);
              }
              else {
                if (in_stack_ffffffffffffff74 != LY_STMT_TYPEDEF) goto LAB_001794b0;
                LVar7 = parse_typedef(ctx,(lysp_node *)parent_00,local_48);
              }
              if (LVar7 != LY_SUCCESS) {
                return LVar7;
              }
              LVar7 = get_keyword(ctx,(ly_stmt *)&stack0xffffffffffffff74,&local_88,&local_80);
              if (LVar7 != LY_SUCCESS) {
                return LVar7;
              }
              if (in_stack_ffffffffffffff74 == LY_STMT_SYNTAX_RIGHT_BRACE) {
                object = (parent_00->field_0).node.exts;
                bVar9 = true;
                if ((object != (lysp_ext_instance *)0x0) &&
                   (LVar7 = ly_set_add(&ctx->main_ctx->ext_inst,object,'\x01',(uint32_t *)0x0),
                   LVar7 != LY_SUCCESS)) {
                  return LVar7;
                }
              }
            } while (!bVar9);
          }
          if (parent == (lysp_node *)0x0) {
            LVar7 = LY_SUCCESS;
          }
          else {
            if (ctx->main_ctx == (lysp_ctx *)0x0) {
              __assert_fail("ctx->main_ctx",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yang.c"
                            ,0xc6a,
                            "LY_ERR parse_grouping(struct lysp_yang_ctx *, struct lysp_node *, struct lysp_node_grp **)"
                           );
            }
            LVar7 = ly_set_add(&ctx->main_ctx->grps_nodes,parent,'\0',(uint32_t *)0x0);
          }
        }
      }
    }
  }
  return LVar7;
}

Assistant:

LY_ERR
parse_grouping(struct lysp_yang_ctx *ctx, struct lysp_node *parent, struct lysp_node_grp **groupings)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_node_grp *grp;

    LY_LIST_NEW_RET(PARSER_CTX(ctx), groupings, grp, next, LY_EMEM);

    /* get value */
    LY_CHECK_RET(get_argument(ctx, Y_IDENTIF_ARG, NULL, &word, &buf, &word_len));
    INSERT_WORD_GOTO(ctx, buf, grp->name, word, word_len, ret, cleanup);
    grp->nodetype = LYS_GROUPING;
    grp->parent = parent;

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, grp->dsc, LY_STMT_DESCRIPTION, 0, &grp->dsc, Y_STR_ARG, NULL, &grp->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, grp->ref, LY_STMT_REFERENCE, 0, &grp->ref, Y_STR_ARG, NULL, &grp->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(parse_status(ctx, &grp->flags, &grp->exts));
            break;

        case LY_STMT_ANYDATA:
            PARSER_CHECK_STMTVER2_RET(ctx, "anydata", "grouping");
        /* fall through */
        case LY_STMT_ANYXML:
            LY_CHECK_RET(parse_any(ctx, kw, &grp->node, &grp->child));
            break;
        case LY_STMT_CHOICE:
            LY_CHECK_RET(parse_choice(ctx, &grp->node, &grp->child));
            break;
        case LY_STMT_CONTAINER:
            LY_CHECK_RET(parse_container(ctx, &grp->node, &grp->child));
            break;
        case LY_STMT_LEAF:
            LY_CHECK_RET(parse_leaf(ctx, &grp->node, &grp->child));
            break;
        case LY_STMT_LEAF_LIST:
            LY_CHECK_RET(parse_leaflist(ctx, &grp->node, &grp->child));
            break;
        case LY_STMT_LIST:
            LY_CHECK_RET(parse_list(ctx, &grp->node, &grp->child));
            break;
        case LY_STMT_USES:
            LY_CHECK_RET(parse_uses(ctx, &grp->node, &grp->child));
            break;

        case LY_STMT_TYPEDEF:
            LY_CHECK_RET(parse_typedef(ctx, &grp->node, &grp->typedefs));
            break;
        case LY_STMT_ACTION:
            PARSER_CHECK_STMTVER2_RET(ctx, "action", "grouping");
            LY_CHECK_RET(parse_action(ctx, &grp->node, &grp->actions));
            break;
        case LY_STMT_GROUPING:
            LY_CHECK_RET(parse_grouping(ctx, &grp->node, &grp->groupings));
            break;
        case LY_STMT_NOTIFICATION:
            PARSER_CHECK_STMTVER2_RET(ctx, "notification", "grouping");
            LY_CHECK_RET(parse_notif(ctx, &grp->node, &grp->notifs));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, grp, LY_STMT_GROUPING, 0, &grp->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "grouping");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, grp->exts, ret, cleanup);
    }

    /* store data for collision check */
    if (parent) {
        assert(ctx->main_ctx);
        LY_CHECK_RET(ly_set_add(&ctx->main_ctx->grps_nodes, parent, 0, NULL));
    }

cleanup:
    return ret;
}